

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filterednormalizer2.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::FilteredNormalizer2::normalize
          (FilteredNormalizer2 *this,UnicodeString *src,UnicodeString *dest,
          USetSpanCondition spanCondition,UErrorCode *errorCode)

{
  short sVar1;
  Normalizer2 *pNVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  UnicodeString tempDest;
  UnicodeString local_70;
  
  tempDest.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4bf0;
  tempDest.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar3 = 0;
  do {
    do {
      while( true ) {
        iVar4 = iVar3;
        sVar1 = (src->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar3 = (src->fUnion).fFields.fLength;
        }
        else {
          iVar3 = (int)sVar1 >> 5;
        }
        if (iVar3 <= iVar4) goto LAB_002f6c4c;
        iVar3 = UnicodeSet::span(this->set,src,iVar4,spanCondition);
        if (spanCondition != USET_SPAN_NOT_CONTAINED) break;
        spanCondition = USET_SPAN_SIMPLE;
        if (iVar3 != iVar4) {
          UnicodeString::doAppend(dest,src,iVar4,iVar3 - iVar4);
          spanCondition = USET_SPAN_SIMPLE;
        }
      }
      spanCondition = USET_SPAN_NOT_CONTAINED;
    } while (iVar3 == iVar4);
    pNVar2 = this->norm2;
    UnicodeString::tempSubStringBetween(&local_70,src,iVar4,iVar3);
    iVar4 = (*(pNVar2->super_UObject)._vptr_UObject[3])(pNVar2,&local_70,&tempDest,errorCode);
    UnicodeString::append(dest,(UnicodeString *)CONCAT44(extraout_var,iVar4));
    UnicodeString::~UnicodeString(&local_70);
    spanCondition = USET_SPAN_NOT_CONTAINED;
  } while (*errorCode < U_ILLEGAL_ARGUMENT_ERROR);
LAB_002f6c4c:
  UnicodeString::~UnicodeString(&tempDest);
  return dest;
}

Assistant:

UnicodeString &
FilteredNormalizer2::normalize(const UnicodeString &src,
                               UnicodeString &dest,
                               USetSpanCondition spanCondition,
                               UErrorCode &errorCode) const {
    UnicodeString tempDest;  // Don't throw away destination buffer between iterations.
    for(int32_t prevSpanLimit=0; prevSpanLimit<src.length();) {
        int32_t spanLimit=set.span(src, prevSpanLimit, spanCondition);
        int32_t spanLength=spanLimit-prevSpanLimit;
        if(spanCondition==USET_SPAN_NOT_CONTAINED) {
            if(spanLength!=0) {
                dest.append(src, prevSpanLimit, spanLength);
            }
            spanCondition=USET_SPAN_SIMPLE;
        } else {
            if(spanLength!=0) {
                // Not norm2.normalizeSecondAndAppend() because we do not want
                // to modify the non-filter part of dest.
                dest.append(norm2.normalize(src.tempSubStringBetween(prevSpanLimit, spanLimit),
                                            tempDest, errorCode));
                if(U_FAILURE(errorCode)) {
                    break;
                }
            }
            spanCondition=USET_SPAN_NOT_CONTAINED;
        }
        prevSpanLimit=spanLimit;
    }
    return dest;
}